

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::
GenerateConstexprAggregateInitializer(SingularString *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    io::Printer::Emit(p,0x34,"\n      /*decltype($field_$)*/ {nullptr, false},\n    ");
    return;
  }
  io::Printer::Emit(p,0x85,
                    "\n      /*decltype($field_$)*/ {\n          &::_pbi::fixed_address_empty_string,\n          ::_pbi::ConstantInitialized{},\n      },\n    "
                   );
  return;
}

Assistant:

void SingularString::GenerateConstexprAggregateInitializer(
    io::Printer* p) const {
  if (is_inlined()) {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {nullptr, false},
    )cc");
  } else {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {
          &::_pbi::fixed_address_empty_string,
          ::_pbi::ConstantInitialized{},
      },
    )cc");
  }
}